

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O1

uint32_t helper_neon_unarrow_sat8_arm(CPUARMState *env,uint64_t x)

{
  uint uVar1;
  uint uVar2;
  
  if ((short)x < 0) {
    (env->vfp).qc[0] = 1;
    uVar1 = 0;
  }
  else if ((x & 0x7f00) == 0) {
    uVar1 = (uint)x & 0xff;
  }
  else {
    (env->vfp).qc[0] = 1;
    uVar1 = 0xff;
  }
  if ((short)(x >> 0x10) < 0) {
    (env->vfp).qc[0] = 1;
  }
  else {
    if ((x >> 0x10 & 0x7f00) == 0) {
      uVar2 = ((uint)(x >> 0x10) & 0xff) << 8;
    }
    else {
      (env->vfp).qc[0] = 1;
      uVar2 = 0xff00;
    }
    uVar1 = uVar1 | uVar2;
  }
  if ((short)(x >> 0x20) < 0) {
    (env->vfp).qc[0] = 1;
  }
  else {
    if ((x >> 0x20 & 0x7f00) == 0) {
      uVar2 = (int)(x >> 0x20) << 0x10;
    }
    else {
      (env->vfp).qc[0] = 1;
      uVar2 = 0xff0000;
    }
    uVar1 = uVar1 | uVar2;
  }
  if (-1 < (long)x) {
    if (x >> 0x38 == 0) {
      uVar2 = (uint)(x >> 0x18) & 0xff000000;
    }
    else {
      (env->vfp).qc[0] = 1;
      uVar2 = 0xff000000;
    }
    return uVar1 | uVar2;
  }
  (env->vfp).qc[0] = 1;
  return uVar1;
}

Assistant:

uint32_t HELPER(neon_unarrow_sat8)(CPUARMState *env, uint64_t x)
{
    uint16_t s;
    uint8_t d;
    uint32_t res = 0;
#define SAT8(n) \
    s = x >> n; \
    if (s & 0x8000) { \
        SET_QC(); \
    } else { \
        if (s > 0xff) { \
            d = 0xff; \
            SET_QC(); \
        } else  { \
            d = s; \
        } \
        res |= (uint32_t)d << (n / 2); \
    }

    SAT8(0);
    SAT8(16);
    SAT8(32);
    SAT8(48);
#undef SAT8
    return res;
}